

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::WindowDataParameter::MergeFrom(WindowDataParameter *this,WindowDataParameter *from)

{
  uint uVar1;
  void *pvVar2;
  LogMessage *other;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x99fd);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->source_,
                 (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                 (from->source_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->mean_file_,
                 (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                 (from->mean_file_).ptr_);
    }
    if ((uVar1 & 4) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->crop_mode_,(string *)&_default_crop_mode__abi_cxx11_,(from->crop_mode_).ptr_
                );
    }
    if ((uVar1 & 8) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->root_folder_,
                 (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                 (from->root_folder_).ptr_);
    }
    if ((uVar1 & 0x10) != 0) {
      this->batch_size_ = from->batch_size_;
    }
    if ((uVar1 & 0x20) != 0) {
      this->crop_size_ = from->crop_size_;
    }
    if ((uVar1 & 0x40) != 0) {
      this->mirror_ = from->mirror_;
    }
    if ((char)uVar1 < '\0') {
      this->cache_images_ = from->cache_images_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  if ((uVar1 & 0x1f00) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      this->context_pad_ = from->context_pad_;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      this->scale_ = from->scale_;
    }
    if ((uVar1 >> 10 & 1) != 0) {
      this->fg_threshold_ = from->fg_threshold_;
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      this->bg_threshold_ = from->bg_threshold_;
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      this->fg_fraction_ = from->fg_fraction_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  return;
}

Assistant:

void WindowDataParameter::MergeFrom(const WindowDataParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.WindowDataParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_source();
      source_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.source_);
    }
    if (cached_has_bits & 0x00000002u) {
      set_has_mean_file();
      mean_file_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.mean_file_);
    }
    if (cached_has_bits & 0x00000004u) {
      set_has_crop_mode();
      crop_mode_.AssignWithDefault(&WindowDataParameter::_default_crop_mode_.get(), from.crop_mode_);
    }
    if (cached_has_bits & 0x00000008u) {
      set_has_root_folder();
      root_folder_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.root_folder_);
    }
    if (cached_has_bits & 0x00000010u) {
      batch_size_ = from.batch_size_;
    }
    if (cached_has_bits & 0x00000020u) {
      crop_size_ = from.crop_size_;
    }
    if (cached_has_bits & 0x00000040u) {
      mirror_ = from.mirror_;
    }
    if (cached_has_bits & 0x00000080u) {
      cache_images_ = from.cache_images_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 7936u) {
    if (cached_has_bits & 0x00000100u) {
      context_pad_ = from.context_pad_;
    }
    if (cached_has_bits & 0x00000200u) {
      scale_ = from.scale_;
    }
    if (cached_has_bits & 0x00000400u) {
      fg_threshold_ = from.fg_threshold_;
    }
    if (cached_has_bits & 0x00000800u) {
      bg_threshold_ = from.bg_threshold_;
    }
    if (cached_has_bits & 0x00001000u) {
      fg_fraction_ = from.fg_fraction_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}